

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O3

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::CatalogSet::GetEntryInternal(CatalogSet *this,CatalogTransaction transaction,string *name)

{
  ulong uVar1;
  pointer pcVar2;
  iterator iVar3;
  optional_ptr<duckdb::CatalogEntry,_true> oVar4;
  TransactionException *this_00;
  optional_ptr<duckdb::CatalogEntry,_true> local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar3 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
                  *)&this->map,name);
  if (((_Rb_tree_header *)iVar3._M_node == &(this->map).entries._M_t._M_impl.super__Rb_tree_header)
     || (local_70.ptr = *(CatalogEntry **)(iVar3._M_node + 2), local_70.ptr == (CatalogEntry *)0x0))
  {
    oVar4.ptr = (CatalogEntry *)0x0;
  }
  else {
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_70);
    oVar4.ptr = local_70.ptr;
    uVar1 = ((local_70.ptr)->timestamp).super___atomic_base<unsigned_long>._M_i;
    if (((0x400000000000005f < uVar1) && (transaction.transaction_id != uVar1)) ||
       ((uVar1 < 0x4000000000000060 && (transaction.start_time < uVar1)))) {
      this_00 = (TransactionException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Catalog write-write conflict on alter with \"%s\"","");
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      pcVar2 = ((oVar4.ptr)->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar2,pcVar2 + ((oVar4.ptr)->name)._M_string_length);
      TransactionException::TransactionException<std::__cxx11::string>(this_00,&local_68,&local_48);
      __cxa_throw(this_00,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
    }
    oVar4.ptr = (CatalogEntry *)0x0;
    if ((local_70.ptr)->deleted == false) {
      oVar4.ptr = local_70.ptr;
    }
  }
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar4.ptr;
}

Assistant:

optional_ptr<CatalogEntry> CatalogSet::GetEntryInternal(CatalogTransaction transaction, const string &name) {
	auto entry_value = map.GetEntry(name);
	if (!entry_value) {
		return nullptr;
	}
	auto &catalog_entry = *entry_value;

	// Check if this entry is visible to our snapshot
	if (HasConflict(transaction, catalog_entry.timestamp)) {
		// We intend to create a new version of the entry.
		// Another transaction has already made an edit to this catalog entry, because of limitations in the Catalog we
		// can't create an edit alongside this even if the other transaction might end up getting aborted. So we have to
		// abort the transaction.
		throw TransactionException("Catalog write-write conflict on alter with \"%s\"", catalog_entry.name);
	}
	// The entry is visible to our snapshot, check if it's deleted
	if (catalog_entry.deleted) {
		return nullptr;
	}
	return &catalog_entry;
}